

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::moveAppend
          (QGenericArrayOps<VkSpecParser::TypedName> *this,TypedName *b,TypedName *e)

{
  TypedName *pTVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pTVar1 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
    qVar5 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
    do {
      pDVar2 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pTVar1[qVar5].name.d.d = pDVar2;
      pcVar3 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pTVar1[qVar5].name.d.ptr = pcVar3;
      qVar4 = (b->name).d.size;
      (b->name).d.size = 0;
      pTVar1[qVar5].name.d.size = qVar4;
      pDVar2 = (b->type).d.d;
      (b->type).d.d = (Data *)0x0;
      pTVar1[qVar5].type.d.d = pDVar2;
      pcVar3 = (b->type).d.ptr;
      (b->type).d.ptr = (char16_t *)0x0;
      pTVar1[qVar5].type.d.ptr = pcVar3;
      qVar4 = (b->type).d.size;
      (b->type).d.size = 0;
      pTVar1[qVar5].type.d.size = qVar4;
      pDVar2 = (b->typeSuffix).d.d;
      (b->typeSuffix).d.d = (Data *)0x0;
      pTVar1[qVar5].typeSuffix.d.d = pDVar2;
      pcVar3 = (b->typeSuffix).d.ptr;
      (b->typeSuffix).d.ptr = (char16_t *)0x0;
      pTVar1[qVar5].typeSuffix.d.ptr = pcVar3;
      qVar4 = (b->typeSuffix).d.size;
      (b->typeSuffix).d.size = 0;
      pTVar1[qVar5].typeSuffix.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size + 1;
      (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }